

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void fs_write_alotof_bufs(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uv_buf_t *bufs;
  char *pcVar4;
  __off64_t _Var5;
  uv_loop_t *puVar6;
  uv_loop_t *puVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  uv_buf_t uVar11;
  char acStack_82 [2];
  uv_loop_t *puStack_80;
  
  unlink("test_file");
  loop = uv_default_loop();
  iVar3 = 0xd4310;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_0015f611:
    fs_write_alotof_bufs_cold_18();
LAB_0015f616:
    fs_write_alotof_bufs_cold_1();
LAB_0015f61b:
    fs_write_alotof_bufs_cold_2();
LAB_0015f620:
    fs_write_alotof_bufs_cold_3();
LAB_0015f625:
    fs_write_alotof_bufs_cold_4();
LAB_0015f62a:
    fs_write_alotof_bufs_cold_17();
LAB_0015f62f:
    fs_write_alotof_bufs_cold_5();
LAB_0015f634:
    fs_write_alotof_bufs_cold_6();
LAB_0015f639:
    fs_write_alotof_bufs_cold_7();
LAB_0015f63e:
    fs_write_alotof_bufs_cold_8();
LAB_0015f643:
    fs_write_alotof_bufs_cold_9();
LAB_0015f648:
    fs_write_alotof_bufs_cold_10();
LAB_0015f64d:
    fs_write_alotof_bufs_cold_12();
LAB_0015f652:
    fs_write_alotof_bufs_cold_13();
LAB_0015f657:
    fs_write_alotof_bufs_cold_14();
LAB_0015f65c:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar3 = 0;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f616;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f61b;
    uv_fs_req_cleanup(&open_req1);
    lVar9 = 8;
    do {
      uVar11 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar9 + -8) = uVar11.base;
      *(size_t *)((long)&bufs->base + lVar9) = uVar11.len;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0xd4318);
    iVar3 = 0;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f620;
    if (write_req.result != 0xac67d) goto LAB_0015f625;
    uv_fs_req_cleanup(&write_req);
    iVar3 = 0xac67d;
    pcVar4 = (char *)malloc(0xac67d);
    if (pcVar4 == (char *)0x0) goto LAB_0015f62a;
    lVar9 = 8;
    pcVar10 = pcVar4;
    do {
      uVar11 = uv_buf_init(pcVar10,0xd);
      *(char **)((long)bufs + lVar9 + -8) = uVar11.base;
      *(size_t *)((long)&bufs->base + lVar9) = uVar11.len;
      lVar9 = lVar9 + 0x10;
      pcVar10 = pcVar10 + 0xd;
    } while (lVar9 != 0xd4318);
    iVar3 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f62f;
    if (close_req.result != 0) goto LAB_0015f634;
    uv_fs_req_cleanup(&close_req);
    iVar3 = 0;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f639;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f63e;
    uv_fs_req_cleanup(&open_req1);
    iVar3 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                       (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f643;
    if (read_req.result != 0x3400) goto LAB_0015f648;
    lVar9 = 0;
    do {
      pcVar10 = pcVar4 + lVar9;
      iVar2 = strncmp(pcVar10,test_buf,0xd);
      iVar3 = (int)pcVar10;
      if (iVar2 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_0015f611;
      }
      lVar9 = lVar9 + 0xd;
    } while (lVar9 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pcVar4);
    iVar3 = (uv_file)open_req1.result;
    _Var5 = lseek64((uv_file)open_req1.result,write_req.result,0);
    if (_Var5 != write_req.result) goto LAB_0015f64d;
    iov = uv_buf_init(buf,0x20);
    iVar3 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 != 0) goto LAB_0015f652;
    if (read_req.result != 0) goto LAB_0015f657;
    uv_fs_req_cleanup(&read_req);
    iVar3 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f65c;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(bufs);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar3);
  fs_write_alotof_bufs_with_offset(iVar3);
  puVar6 = uv_default_loop();
  uv_walk(puVar6,close_walk_cb,(void *)0x0);
  uv_run(puVar6,UV_RUN_DEFAULT);
  puVar7 = uv_default_loop();
  iVar3 = uv_loop_close(puVar7);
  if (iVar3 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_80 = (uv_loop_t *)0x15f6cd;
  unlink("test_file");
  puStack_80 = (uv_loop_t *)0x15f6d2;
  loop = uv_default_loop();
  puStack_80 = (uv_loop_t *)0x15f6e3;
  puVar7 = (uv_loop_t *)malloc(0xd4310);
  if (puVar7 == (uv_loop_t *)0x0) {
LAB_0015fa2f:
    puVar7 = puVar6;
    puStack_80 = (uv_loop_t *)0x15fa34;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_0015fa34:
    puStack_80 = (uv_loop_t *)0x15fa39;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_0015fa39:
    puStack_80 = (uv_loop_t *)0x15fa3e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015fa3e:
    puStack_80 = (uv_loop_t *)0x15fa43;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_0015fa43:
    puStack_80 = (uv_loop_t *)0x15fa48;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_0015fa48:
    puStack_80 = (uv_loop_t *)0x15fa4d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_0015fa4d:
    puStack_80 = (uv_loop_t *)0x15fa52;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_0015fa52:
    puStack_80 = (uv_loop_t *)0x15fa57;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_0015fa57:
    puStack_80 = (uv_loop_t *)0x15fa5c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_0015fa5c:
    puStack_80 = (uv_loop_t *)0x15fa61;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_0015fa61:
    puStack_80 = (uv_loop_t *)0x15fa66;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_0015fa66:
    puStack_80 = (uv_loop_t *)0x15fa6b;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0015fa6b:
    puStack_80 = (uv_loop_t *)0x15fa70;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_0015fa70:
    puStack_80 = (uv_loop_t *)0x15fa75;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_0015fa75:
    puStack_80 = (uv_loop_t *)0x15fa7a;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_80 = (uv_loop_t *)0x15f712;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015fa34;
    if (open_req1.result._4_4_ < 0) goto LAB_0015fa39;
    puStack_80 = (uv_loop_t *)0x15f734;
    uv_fs_req_cleanup(&open_req1);
    puStack_80 = (uv_loop_t *)0x15f745;
    uVar11 = uv_buf_init("0123456789",10);
    puStack_80 = (uv_loop_t *)0x15f783;
    iov = uVar11;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar3 != 10) goto LAB_0015fa3e;
    if (write_req.result != 10) goto LAB_0015fa43;
    puStack_80 = (uv_loop_t *)0x15f7a8;
    uv_fs_req_cleanup(&write_req);
    lVar9 = 8;
    do {
      puStack_80 = (uv_loop_t *)0x15f7c2;
      uVar11 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar7->handle_queue + lVar9 + -0x18) = uVar11.base;
      *(size_t *)((long)puVar7->handle_queue + lVar9 + -0x10) = uVar11.len;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0xd4318);
    puStack_80 = (uv_loop_t *)0x15f803;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar7,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015fa48;
    if (write_req.result != 0xac67d) goto LAB_0015fa4d;
    puStack_80 = (uv_loop_t *)0x15f828;
    uv_fs_req_cleanup(&write_req);
    puStack_80 = (uv_loop_t *)0x15f832;
    pcVar4 = (char *)malloc(0xac67d);
    if (pcVar4 == (char *)0x0) goto LAB_0015fa52;
    lVar9 = 8;
    pcVar10 = pcVar4;
    do {
      puStack_80 = (uv_loop_t *)0x15f854;
      uVar11 = uv_buf_init(pcVar10,0xd);
      *(char **)((long)puVar7->handle_queue + lVar9 + -0x18) = uVar11.base;
      *(size_t *)((long)puVar7->handle_queue + lVar9 + -0x10) = uVar11.len;
      lVar9 = lVar9 + 0x10;
      pcVar10 = pcVar10 + 0xd;
    } while (lVar9 != 0xd4318);
    puStack_80 = (uv_loop_t *)0x15f896;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar7,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015fa57;
    lVar9 = 0xd;
    if (iVar3 != 0xd) {
      lVar9 = 0x3400;
    }
    if (read_req.result != lVar9) goto LAB_0015fa5c;
    pcVar10 = pcVar4;
    uVar8 = 0;
    do {
      puStack_80 = (uv_loop_t *)0x15f8e0;
      iVar2 = strncmp(pcVar10,test_buf,0xd);
      if (iVar2 != 0) {
        puStack_80 = (uv_loop_t *)0x15fa2f;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar6 = puVar7;
        goto LAB_0015fa2f;
      }
      if (iVar3 == 0xd) break;
      pcVar10 = pcVar10 + 0xd;
      bVar1 = uVar8 < 0x3ff;
      uVar8 = uVar8 + 1;
    } while (bVar1);
    puStack_80 = (uv_loop_t *)0x15f90d;
    uv_fs_req_cleanup(&read_req);
    puStack_80 = (uv_loop_t *)0x15f915;
    free(pcVar4);
    puStack_80 = (uv_loop_t *)0x15f92c;
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015fa61;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_0015fa66;
    puStack_80 = (uv_loop_t *)0x15f960;
    uv_fs_req_cleanup(&stat_req);
    puStack_80 = (uv_loop_t *)0x15f971;
    uVar11 = uv_buf_init(buf,0x20);
    puStack_80 = (uv_loop_t *)0x15f9b2;
    iov = uVar11;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015fa6b;
    if (read_req.result != 0) goto LAB_0015fa70;
    puStack_80 = (uv_loop_t *)0x15f9d4;
    uv_fs_req_cleanup(&read_req);
    puStack_80 = (uv_loop_t *)0x15f9ea;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015fa75;
    if (close_req.result == 0) {
      puStack_80 = (uv_loop_t *)0x15fa08;
      uv_fs_req_cleanup(&close_req);
      puStack_80 = (uv_loop_t *)0x15fa14;
      unlink("test_file");
      free(puVar7);
      return;
    }
  }
  puStack_80 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_80 = puVar7;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar3 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar3 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_0015fbf6;
    iVar3 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015fbfb;
    uv_fs_req_cleanup(&open_req1);
    uVar11 = uv_buf_init(acStack_82,2);
    iov = uVar11;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar3 != -0x15) goto LAB_0015fc00;
    uv_fs_req_cleanup(&read_req);
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar6 = uv_default_loop();
      uv_walk(puVar6,close_walk_cb,(void *)0x0);
      uv_run(puVar6,UV_RUN_DEFAULT);
      puVar6 = uv_default_loop();
      iVar3 = uv_loop_close(puVar6);
      if (iVar3 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0015fc0a;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015fbf6:
    run_test_fs_read_dir_cold_2();
LAB_0015fbfb:
    run_test_fs_read_dir_cold_3();
LAB_0015fc00:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_0015fc0a:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_write_alotof_bufs(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;

  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT_NOT_NULL(iovs);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  -1,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT_NOT_NULL(buffer);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
    NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, iovcount, -1, NULL);
  if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT(r >= 0);
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  ASSERT(lseek(open_req1.result, write_req.result, SEEK_SET) == write_req.result);
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 -1,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}